

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_to_spectrum.cc
# Opt level: O0

void __thiscall
sptk::SpectrumToSpectrum::SpectrumToSpectrum
          (SpectrumToSpectrum *this,int fft_length,InputOutputFormats input_format,
          InputOutputFormats output_format,double epsilon,double relative_floor_in_decibels)

{
  bool bVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
  *in_stack_00000078;
  InputOutputFormats in_stack_00000080;
  InputOutputFormats in_stack_00000084;
  value_type *in_stack_ffffffffffffff28;
  Addition *in_stack_ffffffffffffff30;
  FlooringOnLinear *this_00;
  
  *in_RDI = &PTR__SpectrumToSpectrum_00146810;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  *(undefined4 *)(in_RDI + 2) = in_ECX;
  in_RDI[3] = in_XMM0_Qa;
  in_RDI[4] = in_XMM1_Qa;
  std::
  vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
  ::vector((vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
            *)0x114e89);
  *(undefined1 *)(in_RDI + 8) = 1;
  if (((((*(int *)(in_RDI + 1) < 1) || (bVar1 = IsPowerOfTwo(*(int *)(in_RDI + 1)), !bVar1)) ||
       (*(int *)((long)in_RDI + 0xc) < 0)) ||
      ((3 < *(int *)((long)in_RDI + 0xc) || (*(int *)(in_RDI + 2) < 0)))) ||
     ((3 < *(int *)(in_RDI + 2) ||
      (((double)in_RDI[3] <= 0.0 && (double)in_RDI[3] != 0.0 || (0.0 <= (double)in_RDI[4])))))) {
    *(undefined1 *)(in_RDI + 8) = 0;
  }
  else {
    if (((double)in_RDI[3] != 0.0) || (NAN((double)in_RDI[3]))) {
      anon_unknown.dwarf_2aa14::SelectOperation
                (in_stack_00000084,in_stack_00000080,in_stack_00000078);
      operator_new(0x10);
      anon_unknown.dwarf_2aa14::Addition::Addition
                (in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
      std::
      vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
      ::push_back((vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
                   *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      anon_unknown.dwarf_2aa14::SelectOperation
                (in_stack_00000084,in_stack_00000080,in_stack_00000078);
    }
    else {
      anon_unknown.dwarf_2aa14::SelectOperation
                (in_stack_00000084,in_stack_00000080,in_stack_00000078);
    }
    if (((double)in_RDI[4] != -1.79769313486232e+308) || (NAN((double)in_RDI[4]))) {
      switch(*(undefined4 *)(in_RDI + 2)) {
      case 0:
        operator_new(0x10);
        anon_unknown.dwarf_2aa14::FlooringOnLogarithm::FlooringOnLogarithm
                  ((FlooringOnLogarithm *)in_stack_ffffffffffffff30,
                   (double)in_stack_ffffffffffffff28);
        std::
        vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
        ::push_back((vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
                     *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        break;
      case 1:
        operator_new(0x10);
        anon_unknown.dwarf_2aa14::FlooringOnLogarithm::FlooringOnLogarithm
                  ((FlooringOnLogarithm *)in_stack_ffffffffffffff30,
                   (double)in_stack_ffffffffffffff28);
        std::
        vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
        ::push_back((vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
                     *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        break;
      case 2:
        operator_new(0x10);
        pow(10.0,(double)in_RDI[4] * 0.05);
        anon_unknown.dwarf_2aa14::FlooringOnLinear::FlooringOnLinear
                  ((FlooringOnLinear *)in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
        std::
        vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
        ::push_back((vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
                     *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        break;
      case 3:
        this_00 = (FlooringOnLinear *)(in_RDI + 5);
        operator_new(0x10);
        pow(10.0,(double)in_RDI[4] * 0.1);
        anon_unknown.dwarf_2aa14::FlooringOnLinear::FlooringOnLinear
                  (this_00,(double)in_stack_ffffffffffffff28);
        std::
        vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
        ::push_back((vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
                     *)this_00,in_stack_ffffffffffffff28);
      }
    }
  }
  return;
}

Assistant:

SpectrumToSpectrum::SpectrumToSpectrum(int fft_length,
                                       InputOutputFormats input_format,
                                       InputOutputFormats output_format,
                                       double epsilon,
                                       double relative_floor_in_decibels)
    : fft_length_(fft_length),
      input_format_(input_format),
      output_format_(output_format),
      epsilon_(epsilon),
      relative_floor_in_decibels_(relative_floor_in_decibels),
      is_valid_(true) {
  if (fft_length_ <= 0 || !sptk::IsPowerOfTwo(fft_length_) ||
      input_format_ < 0 || kNumInputOutputFormats <= input_format_ ||
      output_format_ < 0 || kNumInputOutputFormats <= output_format_ ||
      epsilon_ < 0.0 || 0.0 <= relative_floor_in_decibels_) {
    is_valid_ = false;
    return;
  }

  if (0.0 != epsilon_) {
    SelectOperation(input_format_, kPowerSpectrum, &operations_);
    operations_.push_back(new Addition(epsilon_));
    SelectOperation(kPowerSpectrum, output_format_, &operations_);
  } else {
    SelectOperation(input_format_, output_format_, &operations_);
  }

  if (sptk::kMin != relative_floor_in_decibels_) {
    switch (output_format_) {
      case kLogAmplitudeSpectrumInDecibels: {
        operations_.push_back(
            new FlooringOnLogarithm(relative_floor_in_decibels_));
        break;
      }
      case kLogAmplitudeSpectrum: {
        operations_.push_back(new FlooringOnLogarithm(
            relative_floor_in_decibels_ / sptk::kNeper));
        break;
      }
      case kAmplitudeSpectrum: {
        operations_.push_back(new FlooringOnLinear(
            std::pow(10.0, 0.05 * relative_floor_in_decibels_)));
        break;
      }
      case kPowerSpectrum: {
        operations_.push_back(new FlooringOnLinear(
            std::pow(10.0, 0.1 * relative_floor_in_decibels_)));
        break;
      }
      default: {
        return;
      }
    }
  }
}